

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O2

REF_STATUS ref_cavity_insert_seg(REF_CAVITY ref_cavity,REF_INT *nodes)

{
  REF_LIST pRVar1;
  REF_GRID pRVar2;
  REF_CELL ref_cell;
  REF_ADJ pRVar3;
  REF_INT *pRVar4;
  REF_ADJ_ITEM pRVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  REF_INT *pRVar11;
  int iVar12;
  int *piVar13;
  long lVar14;
  undefined8 uVar15;
  char *pcVar16;
  REF_INT item;
  REF_INT ntri;
  int local_7c;
  ulong local_78;
  REF_INT face;
  int local_6c;
  REF_INT face_nodes [3];
  REF_BOOL reversed;
  int local_54;
  REF_BOOL all_local;
  REF_BOOL already_have_it;
  REF_NODE local_48;
  REF_GRID local_40;
  long local_38;
  
  uVar7 = ref_cavity_find_seg(ref_cavity,nodes,&local_7c,&reversed);
  if ((uVar7 == 0) || (uVar7 == 5)) {
    lVar10 = (long)local_7c;
    if (lVar10 == -1) {
      iVar9 = ref_cavity->blankseg;
      if (iVar9 == -1) {
        iVar9 = ref_cavity->maxseg;
        iVar12 = 100;
        if (100 < (int)((double)iVar9 * 1.5)) {
          iVar12 = (int)((double)iVar9 * 1.5);
        }
        ref_cavity->maxseg = iVar12 + iVar9;
        fflush(_stdout);
        if (ref_cavity->maxseg < 1) {
          pRVar11 = ref_cavity->s2n;
        }
        else {
          pRVar11 = (REF_INT *)realloc(ref_cavity->s2n,(ulong)(uint)ref_cavity->maxseg * 0xc);
          ref_cavity->s2n = pRVar11;
        }
        if (pRVar11 == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x107,"ref_cavity_insert_seg","realloc ref_cavity->s2n NULL");
          uVar6 = (long)ref_cavity->maxseg * 3;
          printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",uVar6 & 0xffffffff,uVar6
                 ,4,(long)ref_cavity->maxseg * 0xc);
          return 2;
        }
        lVar10 = (long)iVar9;
        piVar13 = pRVar11 + lVar10 * 3 + 1;
        iVar12 = iVar9;
        while( true ) {
          iVar12 = iVar12 + 1;
          if (ref_cavity->maxseg <= lVar10) break;
          piVar13[-1] = -1;
          lVar10 = lVar10 + 1;
          *piVar13 = iVar12;
          piVar13 = piVar13 + 3;
        }
        pRVar11[ref_cavity->maxseg * 3 + -2] = -1;
        ref_cavity->blankseg = iVar9;
      }
      else {
        pRVar11 = ref_cavity->s2n;
      }
      lVar10 = (long)(iVar9 * 3);
      ref_cavity->blankseg = pRVar11[lVar10 + 1];
      for (lVar14 = 0; lVar14 != 2; lVar14 = lVar14 + 1) {
        pRVar11[lVar10 + lVar14] = nodes[lVar14];
      }
      pRVar11[lVar10 + 2] = nodes[2];
      ref_cavity->nseg = ref_cavity->nseg + 1;
      if ((ref_cavity->tet_list->n != 0) && (ref_cavity->state == REF_CAVITY_UNKNOWN)) {
        face_nodes[2] = ref_cavity->surf_node;
        if (face_nodes[2] == -1) {
          face_nodes[2] = ref_cavity->node;
        }
        if ((*nodes != face_nodes[2]) && (nodes[1] != face_nodes[2])) {
          face_nodes[1] = nodes[1];
          face_nodes[0] = *nodes;
          local_7c = iVar9;
          uVar7 = ref_cavity_insert_face(ref_cavity,face_nodes);
          if (uVar7 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0xad,"ref_cavity_add_seg_face",(ulong)uVar7,"add face for seg");
            pcVar16 = "add seg face";
            uVar15 = 0x118;
            goto LAB_001ae3f8;
          }
        }
      }
    }
    else {
      if (reversed == 0) {
        return 3;
      }
      pRVar11 = ref_cavity->s2n;
      if (nodes[2] == pRVar11[lVar10 * 3 + 2]) {
        pRVar11[lVar10 * 3] = -1;
        pRVar11[lVar10 * 3 + 1] = ref_cavity->blankseg;
        ref_cavity->blankseg = local_7c;
        ref_cavity->nseg = ref_cavity->nseg + -1;
        pRVar1 = ref_cavity->tet_list;
        if ((pRVar1->n != 0) && (ref_cavity->state == REF_CAVITY_UNKNOWN)) {
          face_nodes._0_8_ = *(undefined8 *)nodes;
          face_nodes[2] = ref_cavity->surf_node;
          if (face_nodes[2] == -1) {
            face_nodes[2] = ref_cavity->node;
          }
          uVar7 = ref_cavity_find_face(ref_cavity,face_nodes,&face,&ntri);
          if (uVar7 == 0) {
            lVar10 = (long)face;
            if (lVar10 == -1) {
              pcVar16 = "face for a segment missing";
              uVar15 = 0x94;
            }
            else {
              if (ntri != 0) {
                pRVar11 = ref_cavity->f2n;
                pRVar11[lVar10 * 3] = -1;
                pRVar11[lVar10 * 3 + 1] = ref_cavity->blankface;
                ref_cavity->blankface = face;
                ref_cavity->nface = ref_cavity->nface + -1;
                goto LAB_001ae353;
              }
              pcVar16 = "face for a segment removal should be backwards";
              uVar15 = 0x95;
            }
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,uVar15,"ref_cavity_remove_seg_face",pcVar16);
            uVar7 = 1;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x93,"ref_cavity_remove_seg_face",(ulong)uVar7,"find existing face for segment")
            ;
          }
          pcVar16 = "rm seg face";
          uVar15 = 0xf8;
          goto LAB_001ae3f8;
        }
LAB_001ae353:
        pRVar2 = ref_cavity->ref_grid;
        local_48 = pRVar2->node;
        ref_cell = pRVar2->cell[8];
        if (((ref_cavity->seg_rm_adds_tet != 0) || (pRVar1->n != 0)) &&
           (ref_cavity->state == REF_CAVITY_UNKNOWN)) {
          uVar7 = ref_cell_list_with2(pRVar2->cell[3],*nodes,nodes[1],2,&ntri,&face);
          if (uVar7 == 0) {
            local_40 = pRVar2;
            if ((long)ntri == 2) {
              iVar9 = *nodes;
              local_78 = 0xffffffff;
              item = -1;
              if (-1 < (long)iVar9) {
                pRVar3 = ref_cell->ref_adj;
                local_78 = 0xffffffff;
                item = -1;
                if (iVar9 < pRVar3->nnode) {
                  uVar7 = pRVar3->first[iVar9];
                  local_78 = 0xffffffff;
                  item = -1;
                  if ((long)(int)uVar7 != -1) {
                    item = pRVar3->item[(int)uVar7].ref;
                    local_78 = (ulong)uVar7;
                  }
                }
              }
              uVar7 = 0;
              while ((int)local_78 != -1) {
                for (iVar9 = 0; iVar9 < ref_cell->node_per; iVar9 = iVar9 + 1) {
                  if (nodes[1] == ref_cell->c2n[ref_cell->size_per * item + iVar9]) {
                    uVar8 = ref_list_contains(ref_cavity->tet_list,item,&already_have_it);
                    if (uVar8 == 0) {
                      if (already_have_it != 0) goto LAB_001ae70a;
                      uVar8 = ref_list_push(ref_cavity->tet_list,item);
                      if (uVar8 == 0) {
                        uVar8 = ref_cell_all_local(ref_cell,local_48,item,&all_local);
                        if (uVar8 == 0) {
                          if (all_local != 0) {
                            lVar10 = 0;
                            while (lVar10 < ref_cell->face_per) {
                              pRVar11 = ref_cell->c2n;
                              pRVar4 = ref_cell->f2n;
                              for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
                                face_nodes[lVar14] =
                                     pRVar11[(long)item * (long)ref_cell->size_per +
                                             (long)pRVar4[(ulong)((uint)lVar10 & 0x3fffffff) * 4 +
                                                          lVar14]];
                              }
                              local_38 = lVar10;
                              uVar8 = ref_cell_with(local_40->cell[3],face_nodes,&local_54);
                              if ((uVar8 != 0) && (uVar8 != 5)) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                       ,0xd8,"ref_cavity_remove_seg_add_tets",(ulong)uVar8,
                                       "search for boundary tri");
                                uVar7 = uVar8;
                              }
                              if ((uVar8 != 5) && (uVar8 != 0)) {
                                if (uVar7 != 0) goto LAB_001ae9f7;
                                goto LAB_001aea23;
                              }
                              if (((local_54 == -1) ||
                                  ((local_54 != face && (local_54 != local_6c)))) &&
                                 (uVar8 = ref_cavity_insert_face(ref_cavity,face_nodes), uVar8 != 0)
                                 ) {
                                pcVar16 = "tet face rm seg";
                                uVar15 = 0xdd;
                                goto LAB_001ae9ea;
                              }
                              lVar10 = local_38 + 1;
                            }
                            goto LAB_001ae70a;
                          }
                          ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
                          goto LAB_001aea23;
                        }
                        pcVar16 = "local cell";
                        uVar15 = 0xcd;
                      }
                      else {
                        pcVar16 = "save tet";
                        uVar15 = 0xcc;
                      }
                    }
                    else {
                      pcVar16 = "have tet?";
                      uVar15 = 0xca;
                    }
LAB_001ae9ea:
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                           ,uVar15,"ref_cavity_remove_seg_add_tets",(ulong)uVar8,pcVar16);
                    uVar7 = uVar8;
                    goto LAB_001ae9f7;
                  }
LAB_001ae70a:
                }
                pRVar5 = ref_cell->ref_adj->item;
                local_78 = (ulong)pRVar5[(int)local_78].next;
                item = -1;
                if (local_78 != 0xffffffffffffffff) {
                  item = pRVar5[local_78].ref;
                }
              }
              goto LAB_001aea23;
            }
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0xc4,"ref_cavity_remove_seg_add_tets","cavity segment does not have two tri",2,
                   (long)ntri);
            uVar7 = 1;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0xc3,"ref_cavity_remove_seg_add_tets",(ulong)uVar7,"tri with2");
          }
LAB_001ae9f7:
          pcVar16 = "rm seg tets";
          uVar15 = 0xf9;
          goto LAB_001ae3f8;
        }
      }
      else {
        ref_cavity->state = REF_CAVITY_BOUNDARY_CONSTRAINED;
      }
    }
LAB_001aea23:
    uVar7 = 0;
  }
  else {
    pcVar16 = "find existing";
    uVar15 = 0xea;
LAB_001ae3f8:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",uVar15
           ,"ref_cavity_insert_seg",(ulong)uVar7,pcVar16);
  }
  return uVar7;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_insert_seg(REF_CAVITY ref_cavity,
                                         REF_INT *nodes) {
  REF_INT node, seg;
  REF_INT orig, chunk;
  REF_BOOL reversed;

  RXS(ref_cavity_find_seg(ref_cavity, nodes, &seg, &reversed), REF_NOT_FOUND,
      "find existing");

  if (REF_EMPTY != seg) {
    if (reversed) { /* two segs with opposite orientation destroy each other */
      if (nodes[2] != ref_cavity_s2n(ref_cavity, 2, seg)) {
        /* mixing faceid would violate topology */
        ref_cavity_state(ref_cavity) = REF_CAVITY_BOUNDARY_CONSTRAINED;
        return REF_SUCCESS;
      }
      ref_cavity_s2n(ref_cavity, 0, seg) = REF_EMPTY;
      ref_cavity_s2n(ref_cavity, 1, seg) = ref_cavity_blankseg(ref_cavity);
      ref_cavity_blankseg(ref_cavity) = seg;

      ref_cavity_nseg(ref_cavity)--;
      RSS(ref_cavity_remove_seg_face(ref_cavity, nodes), "rm seg face");
      RSS(ref_cavity_remove_seg_add_tets(ref_cavity, nodes), "rm seg tets");

      return REF_SUCCESS;
    } else { /* can't happen, added same seg twice */
      return REF_INVALID;
    }
  }

  /* if I need to grow my array of segs */
  if (REF_EMPTY == ref_cavity_blankseg(ref_cavity)) {
    orig = ref_cavity_maxseg(ref_cavity);
    chunk = MAX(100, (REF_INT)(1.5 * (REF_DBL)orig));
    ref_cavity_maxseg(ref_cavity) = orig + chunk;

    ref_realloc(ref_cavity->s2n, 3 * ref_cavity_maxseg(ref_cavity), REF_INT);

    for (seg = orig; seg < ref_cavity_maxseg(ref_cavity); seg++) {
      ref_cavity_s2n(ref_cavity, 0, seg) = REF_EMPTY;
      ref_cavity_s2n(ref_cavity, 1, seg) = seg + 1;
    }
    ref_cavity_s2n(ref_cavity, 1, (ref_cavity->maxseg) - 1) = REF_EMPTY;
    ref_cavity_blankseg(ref_cavity) = orig;
  }

  seg = ref_cavity_blankseg(ref_cavity);
  ref_cavity_blankseg(ref_cavity) = ref_cavity_s2n(ref_cavity, 1, seg);
  for (node = 0; node < 2; node++)
    ref_cavity_s2n(ref_cavity, node, seg) = nodes[node];
  ref_cavity_s2n(ref_cavity, 2, seg) = nodes[2]; /* faceid */

  ref_cavity_nseg(ref_cavity)++;
  RSS(ref_cavity_add_seg_face(ref_cavity, nodes), "add seg face");

  return REF_SUCCESS;
}